

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O0

void __thiscall
Hospital::Show_Specific_Staff
          (Hospital *this,vector<Doctor,_std::allocator<Doctor>_> *All_Of_Doctors,string *id)

{
  __type _Var1;
  ulong uVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  ostream *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  int local_44;
  undefined1 local_40 [4];
  int j;
  int local_24;
  string *psStack_20;
  int i;
  string *id_local;
  vector<Doctor,_std::allocator<Doctor>_> *All_Of_Doctors_local;
  Hospital *this_local;
  
  psStack_20 = id;
  id_local = (string *)All_Of_Doctors;
  All_Of_Doctors_local = (vector<Doctor,_std::allocator<Doctor>_> *)this;
  for (local_24 = 0; uVar2 = (ulong)local_24,
      sVar3 = std::vector<Doctor,_std::allocator<Doctor>_>::size(All_Of_Doctors), uVar2 < sVar3;
      local_24 = local_24 + 1) {
    pvVar4 = std::vector<Doctor,_std::allocator<Doctor>_>::operator[](All_Of_Doctors,(long)local_24)
    ;
    Doctor::doctor_all_ino_getter_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_40,pvVar4);
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_40,0);
    _Var1 = std::operator==(pvVar5,id);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_40);
    if (_Var1) {
      local_44 = 0;
      while( true ) {
        uVar2 = (ulong)local_44;
        pvVar4 = std::vector<Doctor,_std::allocator<Doctor>_>::operator[]
                           (All_Of_Doctors,(long)local_24);
        Doctor::doctor_all_ino_getter_abi_cxx11_(&local_60,pvVar4);
        sVar3 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&local_60);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_60);
        if (sVar3 <= uVar2) break;
        pvVar4 = std::vector<Doctor,_std::allocator<Doctor>_>::operator[]
                           (All_Of_Doctors,(long)local_24);
        Doctor::doctor_all_ino_getter_abi_cxx11_(&local_78,pvVar4);
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&local_78,(long)local_44);
        this_00 = std::operator<<((ostream *)&std::cout,(string *)pvVar5);
        std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_78);
        local_44 = local_44 + 1;
      }
    }
  }
  return;
}

Assistant:

void Hospital:: Show_Specific_Staff(vector<Doctor> All_Of_Doctors , string id){
    for (int i = 0; i <All_Of_Doctors.size() ; ++i) {
        if (All_Of_Doctors[i].doctor_all_ino_getter()[0]==id){
            for (int j = 0; j <All_Of_Doctors[i].doctor_all_ino_getter().size() ; ++j) {
                cout <<All_Of_Doctors[i].doctor_all_ino_getter()[j]<<endl;
            }
        }
    }
}